

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingDemo.cpp
# Opt level: O1

int main(void)

{
  AbstractLoggingDevice *this;
  AbstractFormatter *pAVar1;
  FileLogger *this_00;
  ostream *poVar2;
  ostringstream __stream__unique__;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [96];
  ios_base local_130 [264];
  
  this = (AbstractLoggingDevice *)operator_new(0x10);
  pAVar1 = (AbstractFormatter *)operator_new(0x10);
  pAVar1->mNewLine = No;
  pAVar1->_vptr_AbstractFormatter = (_func_int **)&PTR__AbstractFormatter_00105c98;
  SLogLib::ConsoleLogger::ConsoleLogger((ConsoleLogger *)this,pAVar1);
  SLogLib::addLoggingDevice(this);
  this_00 = (FileLogger *)operator_new(0x18);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"foo.log","");
  pAVar1 = (AbstractFormatter *)operator_new(0x10);
  pAVar1->mNewLine = No;
  pAVar1->_vptr_AbstractFormatter = (_func_int **)&PTR__AbstractFormatter_00105d60;
  SLogLib::FileLogger::FileLogger(this_00,(string *)local_1a0,_S_app,Immediately,pAVar1);
  SLogLib::addLoggingDevice((AbstractLoggingDevice *)this_00);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"a = ",4);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," b = ",5);
  std::ostream::_M_insert<double>(15.3);
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/saurabhg17[P]SLogLib/Examples/LoggingDemo/LoggingDemo.cpp"
             ,"");
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"main","");
  std::__cxx11::stringbuf::str();
  SLogLib::writeMessage((string *)local_1e0,(string *)local_200,0x16,Info,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0]);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Success",7);
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/saurabhg17[P]SLogLib/Examples/LoggingDemo/LoggingDemo.cpp"
             ,"");
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"main","");
  std::__cxx11::stringbuf::str();
  SLogLib::writeMessage((string *)local_1e0,(string *)local_200,0x17,Info,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0]);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return 0;
}

Assistant:

int main()
{
	// Add these lines at the beginning of your program.
	// The devices and formatters are automatically deleted by SLogLib.
	using namespace SLogLib;
	addLoggingDevice(new ConsoleLogger(new NullFormatter));
	addLoggingDevice(new FileLogger("foo.log", std::ios_base::app, FileOpenFlag::Immediately, new DetailedFormatter));
	
	// The following line writes the message to both console and file.
	int a = 10;
	double b = 15.3;
	const char* c = "Success";
	SLOGLIB_LOG_MSG_INFO("a = " << a << " b = " << b);
	SLOGLIB_LOG_MSG_INFO(c);
	
	return 0;
}